

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  cmLocalCommonGenerator *pcVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char cVar6;
  cmStateSnapshot *c;
  pointer ppcVar7;
  pointer this_01;
  undefined7 in_register_00000089;
  allocator<char> local_11d;
  undefined4 local_11c;
  cmLocalUnixMakefileGenerator3 *local_118;
  char *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string doc;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  string makeTarget;
  string local_50;
  
  local_11c = (undefined4)CONCAT71(in_register_00000089,check_relink);
  local_118 = lg;
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
  std::__cxx11::string::string((string *)&makeTarget,(string *)psVar5);
  std::__cxx11::string::append((char *)&makeTarget);
  std::__cxx11::string::append((char *)&makeTarget);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppcVar7 = (local_118->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (local_118->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  cVar6 = (char)local_11c;
  pcVar2 = &local_118->super_cmLocalCommonGenerator;
  local_110 = pass;
  do {
    if (ppcVar7 == ppcVar1) {
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&doc,(cmLocalGenerator *)local_118);
      cmStateSnapshot::GetChildren(&children,(cmStateSnapshot *)&doc);
      for (this_01 = children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          this_01 !=
          children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
          super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&doc,this_01);
        psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&doc);
        std::__cxx11::string::string((string *)&no_commands,(string *)psVar5);
        std::__cxx11::string::append((char *)&no_commands);
        std::__cxx11::string::append((char *)&no_commands);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&no_commands
                  );
        std::__cxx11::string::~string((string *)&no_commands);
      }
      if ((depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->EmptyRuleHackDepends)._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&this->EmptyRuleHackDepends);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&doc,"Convenience name for \"",(allocator<char> *)&no_commands);
      std::__cxx11::string::append((char *)&doc);
      std::__cxx11::string::append((char *)&doc);
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (local_118,ruleFileStream,doc._M_dataplus._M_p,&makeTarget,&depends,&no_commands,
                 true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_commands);
      std::__cxx11::string::~string((string *)&doc);
      std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
                (&children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&makeTarget);
      return;
    }
    this_00 = *ppcVar7;
    TVar4 = cmGeneratorTarget::GetType(this_00);
    if (TVar4 < GLOBAL_TARGET) {
      if (check_all) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"EXCLUDE_FROM_ALL",&local_11d);
        bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
        if (bVar3 || cVar6 != '\x01') {
          bVar3 = !bVar3;
LAB_002bc461:
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
LAB_002bc44a:
          bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,&pcVar2->ConfigName);
          if (check_all) goto LAB_002bc461;
        }
        if (bVar3 == false) goto LAB_002bc4af;
      }
      else if ((char)local_11c != '\0') goto LAB_002bc44a;
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&doc,local_118,this_00);
      std::__cxx11::string::append((char *)&doc);
      std::__cxx11::string::append((char *)&doc);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,&doc)
      ;
      std::__cxx11::string::~string((string *)&doc);
    }
LAB_002bc4af:
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += "/";
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
  for (cmGeneratorTarget* gtarget : targets) {
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(std::move(tname));
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  std::vector<cmStateSnapshot> children = lg->GetStateSnapshot().GetChildren();
  for (cmStateSnapshot const& c : children) {
    std::string subdir = c.GetDirectory().GetCurrentBinary();
    subdir += "/";
    subdir += pass;
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc = "Convenience name for \"";
  doc += pass;
  doc += "\" pass in the directory.";
  std::vector<std::string> no_commands;
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                    no_commands, true);
}